

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestChildExtensionData::~TestChildExtensionData(TestChildExtensionData *this)

{
  ~TestChildExtensionData(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TestChildExtensionData::~TestChildExtensionData() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestChildExtensionData)
  SharedDtor(*this);
}